

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

void __thiscall soplex::SPxMainSM<double>::SPxMainSM(SPxMainSM<double> *this,SPxMainSM<double> *old)

{
  double dVar1;
  Result RVar2;
  
  SPxSimplifier<double>::SPxSimplifier
            (&this->super_SPxSimplifier<double>,&old->super_SPxSimplifier<double>);
  (this->super_SPxSimplifier<double>)._vptr_SPxSimplifier = (_func_int **)&PTR__SPxMainSM_0069e470;
  std::vector<double,_std::allocator<double>_>::vector(&(this->m_prim).val,&(old->m_prim).val);
  std::vector<double,_std::allocator<double>_>::vector(&(this->m_slack).val,&(old->m_slack).val);
  std::vector<double,_std::allocator<double>_>::vector(&(this->m_dual).val,&(old->m_dual).val);
  std::vector<double,_std::allocator<double>_>::vector(&(this->m_redCost).val,&(old->m_redCost).val)
  ;
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::DataArray
            (&this->m_cBasisStat,&old->m_cBasisStat);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::DataArray
            (&this->m_rBasisStat,&old->m_rBasisStat);
  DataArray<int>::DataArray(&this->m_cIdx,&old->m_cIdx);
  DataArray<int>::DataArray(&this->m_rIdx,&old->m_rIdx);
  Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::Array(&this->m_hist,&old->m_hist);
  Array<soplex::DSVectorBase<double>_>::Array(&this->m_classSetRows,0);
  Array<soplex::DSVectorBase<double>_>::Array(&this->m_classSetCols,0);
  Array<soplex::DSVectorBase<double>_>::Array(&this->m_dupRows,0);
  Array<soplex::DSVectorBase<double>_>::Array(&this->m_dupCols,0);
  this->m_postsolved = old->m_postsolved;
  DataArray<int>::DataArray(&this->m_stat,&old->m_stat);
  this->m_thesense = old->m_thesense;
  this->m_keepbounds = old->m_keepbounds;
  RVar2 = old->m_result;
  this->m_addedcols = old->m_addedcols;
  this->m_result = RVar2;
  dVar1 = old->m_pseudoobj;
  this->m_cutoffbound = old->m_cutoffbound;
  this->m_pseudoobj = dVar1;
  return;
}

Assistant:

SPxMainSM(const SPxMainSM& old)
      : SPxSimplifier<R>(old)
      , m_prim(old.m_prim)
      , m_slack(old.m_slack)
      , m_dual(old.m_dual)
      , m_redCost(old.m_redCost)
      , m_cBasisStat(old.m_cBasisStat)
      , m_rBasisStat(old.m_rBasisStat)
      , m_cIdx(old.m_cIdx)
      , m_rIdx(old.m_rIdx)
      , m_hist(old.m_hist)
      , m_postsolved(old.m_postsolved)
      , m_stat(old.m_stat)
      , m_thesense(old.m_thesense)
      , m_keepbounds(old.m_keepbounds)
      , m_addedcols(old.m_addedcols)
      , m_result(old.m_result)
      , m_cutoffbound(old.m_cutoffbound)
      , m_pseudoobj(old.m_pseudoobj)
   {
      ;
   }